

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O3

_Bool sx_coro_replace_callback(sx_coro_context *ctx,sx_fiber_cb *callback,sx_fiber_cb *new_callback)

{
  int iVar1;
  sx__coro_state *psVar2;
  sx__coro_state *psVar3;
  sx_pool *psVar4;
  code *pcVar5;
  sx__coro_state *psVar6;
  undefined1 uVar7;
  _Bool _Var8;
  sx_fiber_t pvVar9;
  sx__pool_page *psVar10;
  uintptr_t uptr;
  
  if (callback == (sx_fiber_cb *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x119,"callback");
    pcVar5 = (code *)swi(3);
    uVar7 = (*pcVar5)();
    return (_Bool)uVar7;
  }
  _Var8 = false;
  psVar2 = ctx->run_list;
  while( true ) {
    while( true ) {
      do {
        psVar6 = psVar2;
        if (psVar6 == (sx__coro_state *)0x0) {
          return _Var8;
        }
        psVar2 = psVar6->next;
      } while (psVar6->callback != callback);
      if (new_callback == (sx_fiber_cb *)0x0) break;
      psVar6->callback = new_callback;
      pvVar9 = (sx_fiber_t)
               make_fcontext((psVar6->stack_mem).sptr,(psVar6->stack_mem).ssize,new_callback);
      psVar6->fiber = pvVar9;
      _Var8 = true;
    }
    psVar3 = psVar6->prev;
    if (psVar3 != (sx__coro_state *)0x0) {
      psVar3->next = psVar2;
    }
    if (psVar2 != (sx__coro_state *)0x0) {
      psVar2->prev = psVar3;
    }
    if (ctx->run_list == psVar6) {
      ctx->run_list = psVar2;
    }
    if (ctx->run_list_last == psVar6) {
      ctx->run_list_last = psVar6->prev;
    }
    psVar6->next = (sx__coro_state *)0x0;
    psVar6->prev = (sx__coro_state *)0x0;
    psVar4 = ctx->coro_pool;
    psVar10 = psVar4->pages;
    if (psVar10 == (sx__pool_page *)0x0) break;
    while ((psVar3 = (sx__coro_state *)psVar10->buff, psVar6 < psVar3 ||
           ((sx__coro_state *)
            ((long)&psVar3->fiber + (long)psVar4->item_sz * (long)psVar4->capacity) <= psVar6))) {
      psVar10 = psVar10->next;
      if (psVar10 == (sx__pool_page *)0x0) goto LAB_0010a0bf;
    }
    if ((ulong)((long)psVar6 - (long)psVar3) % (ulong)(long)psVar4->item_sz != 0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0xd6,"ptr is not aligned to items, probably invalid");
      pcVar5 = (code *)swi(3);
      uVar7 = (*pcVar5)();
      return (_Bool)uVar7;
    }
    iVar1 = psVar10->iter;
    if (iVar1 == psVar4->capacity) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0xd8,"cannot delete more objects, possible double delete");
      pcVar5 = (code *)swi(3);
      uVar7 = (*pcVar5)();
      return (_Bool)uVar7;
    }
    psVar10->iter = iVar1 + 1;
    psVar10->ptrs[iVar1] = psVar6;
  }
LAB_0010a0bf:
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                    ,0xe0,"pointer does not blong to the pool");
  pcVar5 = (code *)swi(3);
  uVar7 = (*pcVar5)();
  return (_Bool)uVar7;
}

Assistant:

bool sx_coro_replace_callback(sx_coro_context* ctx, sx_fiber_cb* callback,
                              sx_fiber_cb* new_callback)
{
    sx_assert(callback);
    bool r = false;

    sx__coro_state* fs = ctx->run_list;
    while (fs) {
        sx__coro_state* next = fs->next;

        // just remove the fiber if the new callback is NULL
        if (fs->callback == callback) {
            if (new_callback) {
                fs->callback = new_callback;
                fs->fiber = sx_fiber_create(fs->stack_mem, new_callback);
                r = true;
            } else {
                sx__coro_remove_list(&ctx->run_list, &ctx->run_list_last, fs);
                sx_pool_del(ctx->coro_pool, fs);
            }
        }
        fs = next;
    }

    return r;
}